

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O2

void generate_specialized_template<unsigned_short>(unsigned_short denom)

{
  ostream *poVar1;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"template<> struct libdivide_constants");
  poVar1 = std::operator<<(poVar1,"<");
  poVar1 = std::operator<<(poVar1,"uint16_t");
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,denom);
  poVar1 = std::operator<<(poVar1,"> ");
  poVar1 = std::operator<<(poVar1,"{ ");
  poVar1 = std::operator<<(poVar1,"static constexpr ");
  poVar1 = std::operator<<(poVar1,"libdivide_u16_t");
  poVar1 = std::operator<<(poVar1," libdivide = { ");
  poVar1 = std::operator<<(poVar1,".magic = ");
  const_macro_name<unsigned_short>(&local_38,denom);
  std::operator+(&local_58,&local_38,"_MAGIC, ");
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,".more = ");
  const_macro_name<unsigned_short>(&sStack_98,denom);
  std::operator+(&local_78,&sStack_98,"_MORE};");
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  std::operator<<(poVar1,"};\n");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void generate_specialized_template(_IntT denom) {
    std::cout << "template<> struct libdivide_constants"
        << "<" << type_name<_IntT>::get_name() << "," << denom << "> "
        << "{ "
        << "static constexpr " << struct_selector<_IntT>::get_name() << " libdivide = { "
        <<              ".magic = " << const_macro_name(denom)+"_MAGIC, "
        <<              ".more = " <<  const_macro_name(denom)+"_MORE};"
        << "};\n";
}